

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::BuildLocalStackingContext(Element *this)

{
  Element *pEVar1;
  iterator __first;
  iterator __last;
  size_type sVar2;
  reference pvVar3;
  reference ppEVar4;
  ulong local_50;
  size_t i;
  undefined1 local_28 [8];
  Vector<StackingContextChild> stacking_children;
  Element *this_local;
  
  this->stacking_context_dirty = false;
  stacking_children.
  super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ::std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::vector
            ((vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_> *)
             local_28);
  AddChildrenToStackingContext
            (this,(vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_> *)
                  local_28);
  __first = ::std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::
            begin((vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_> *)
                  local_28);
  __last = ::std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::end
                     ((vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                       *)local_28);
  ::std::
  stable_sort<__gnu_cxx::__normal_iterator<Rml::StackingContextChild*,std::vector<Rml::StackingContextChild,std::allocator<Rml::StackingContextChild>>>>
            ((__normal_iterator<Rml::StackingContextChild_*,_std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>_>
              )__first._M_current,
             (__normal_iterator<Rml::StackingContextChild_*,_std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>_>
              )__last._M_current);
  sVar2 = ::std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::size
                    ((vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                      *)local_28);
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::resize
            (&this->stacking_context,sVar2);
  local_50 = 0;
  while( true ) {
    sVar2 = ::std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::
            size((vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_> *)
                 local_28);
    if (sVar2 <= local_50) break;
    pvVar3 = ::std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::
             operator[]((vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                         *)local_28,local_50);
    pEVar1 = pvVar3->element;
    ppEVar4 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::operator[]
                        (&this->stacking_context,local_50);
    *ppEVar4 = pEVar1;
    local_50 = local_50 + 1;
  }
  ::std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::~vector
            ((vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_> *)
             local_28);
  return;
}

Assistant:

void Element::BuildLocalStackingContext()
{
	stacking_context_dirty = false;

	Vector<StackingContextChild> stacking_children;
	AddChildrenToStackingContext(stacking_children);
	std::stable_sort(stacking_children.begin(), stacking_children.end());

	stacking_context.resize(stacking_children.size());
	for (size_t i = 0; i < stacking_children.size(); i++)
		stacking_context[i] = stacking_children[i].element;
}